

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::AMFImporter::Find_NodeElement
          (AMFImporter *this,string *pID,EType pType,CAMFImporter_NodeElement **pNodeElement)

{
  pointer __s2;
  size_t sVar1;
  CAMFImporter_NodeElement *pCVar2;
  size_t __n;
  int iVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  
  p_Var4 = (this->mNodeElement_List).
           super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  bVar5 = p_Var4 != (_List_node_base *)&this->mNodeElement_List;
  if (bVar5) {
    __s2 = (pID->_M_dataplus)._M_p;
    sVar1 = pID->_M_string_length;
    do {
      pCVar2 = (CAMFImporter_NodeElement *)p_Var4[1]._M_next;
      __n = (pCVar2->ID)._M_string_length;
      if ((__n == sVar1) &&
         (((__n == 0 || (iVar3 = bcmp((pCVar2->ID)._M_dataplus._M_p,__s2,__n), iVar3 == 0)) &&
          (pCVar2->Type == pType)))) {
        if (pNodeElement == (CAMFImporter_NodeElement **)0x0) {
          return bVar5;
        }
        *pNodeElement = pCVar2;
        return bVar5;
      }
      p_Var4 = p_Var4->_M_next;
      bVar5 = p_Var4 != (_List_node_base *)&this->mNodeElement_List;
    } while (bVar5);
  }
  return bVar5;
}

Assistant:

bool AMFImporter::Find_NodeElement(const std::string& pID, const CAMFImporter_NodeElement::EType pType, CAMFImporter_NodeElement** pNodeElement) const
{
	for(CAMFImporter_NodeElement* ne: mNodeElement_List)
	{
		if((ne->ID == pID) && (ne->Type == pType))
		{
			if(pNodeElement != nullptr) *pNodeElement = ne;

			return true;
		}
	}// for(CAMFImporter_NodeElement* ne: mNodeElement_List)

	return false;
}